

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O3

void Gia_ManGlaCollect(Gia_Man_t *p,Vec_Int_t *vGateClasses,Vec_Int_t **pvPis,Vec_Int_t **pvPPis,
                      Vec_Int_t **pvFlops,Vec_Int_t **pvNodes)

{
  int iVar1;
  int Entry;
  ulong uVar2;
  uint uVar3;
  Vec_Int_t *__ptr;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t **ppVVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  if (p->vCos->nSize - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xa3,
                  "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                 );
  }
  if (vGateClasses->nSize != p->nObjs) {
    __assert_fail("Vec_IntSize(vGateClasses) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xa4,
                  "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                 );
  }
  __ptr = Gia_GlaCollectAssigned(p,vGateClasses);
  if (pvPis != (Vec_Int_t **)0x0) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(400);
    pVVar4->pArray = piVar5;
    *pvPis = pVVar4;
  }
  if (pvPPis != (Vec_Int_t **)0x0) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(400);
    pVVar4->pArray = piVar5;
    *pvPPis = pVVar4;
  }
  if (pvFlops != (Vec_Int_t **)0x0) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(400);
    pVVar4->pArray = piVar5;
    *pvFlops = pVVar4;
  }
  if (pvNodes != (Vec_Int_t **)0x0) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 1000;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(4000);
    pVVar4->pArray = piVar5;
    *pvNodes = pVVar4;
  }
  iVar1 = __ptr->nSize;
  piVar5 = __ptr->pArray;
  if ((long)iVar1 < 1) {
    if (piVar5 == (int *)0x0) goto LAB_0060136a;
  }
  else {
    lVar9 = 0;
    do {
      Entry = piVar5[lVar9];
      lVar8 = (long)Entry;
      if ((lVar8 < 0) || (p->nObjs <= Entry)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar2 = *(ulong *)(p->pObjs + lVar8);
      uVar3 = (uint)uVar2;
      uVar7 = (uint)(uVar2 >> 0x20);
      if (((uVar3 & 0x9fffffff) == 0x9fffffff) &&
         (ppVVar6 = pvPis, (int)(uVar7 & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
LAB_0060133f:
        if (ppVVar6 != (Vec_Int_t **)0x0) {
          Vec_IntPush(*ppVVar6,Entry);
        }
      }
      else {
        if (vGateClasses->nSize <= Entry) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        ppVVar6 = pvPPis;
        if ((vGateClasses->pArray[lVar8] == 0) ||
           ((((uVar3 & 0x9fffffff) == 0x9fffffff &&
             (ppVVar6 = pvFlops, p->vCis->nSize - p->nRegs <= (int)(uVar7 & 0x1fffffff))) ||
            (ppVVar6 = pvNodes, (~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3)))) goto LAB_0060133f;
        if ((~uVar2 & 0x1fffffff1fffffff) != 0) {
          __assert_fail("Gia_ObjIsConst0(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                        ,0xb6,
                        "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                       );
        }
      }
      lVar9 = lVar9 + 1;
    } while (iVar1 != lVar9);
  }
  free(piVar5);
LAB_0060136a:
  free(__ptr);
  return;
}

Assistant:

void Gia_ManGlaCollect( Gia_Man_t * p, Vec_Int_t * vGateClasses, Vec_Int_t ** pvPis, Vec_Int_t ** pvPPis, Vec_Int_t ** pvFlops, Vec_Int_t ** pvNodes )
{ 
    Vec_Int_t * vAssigned;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Vec_IntSize(vGateClasses) == Gia_ManObjNum(p) );
    // create included objects and their fanins
    vAssigned = Gia_GlaCollectAssigned( p, vGateClasses );
    // create additional arrays
    if ( pvPis )   *pvPis   = Vec_IntAlloc( 100 );
    if ( pvPPis )  *pvPPis  = Vec_IntAlloc( 100 );
    if ( pvFlops ) *pvFlops = Vec_IntAlloc( 100 );
    if ( pvNodes ) *pvNodes = Vec_IntAlloc( 1000 );
    Gia_ManForEachObjVec( vAssigned, p, pObj, i )
    {
        if ( Gia_ObjIsPi(p, pObj) )
            { if ( pvPis )   Vec_IntPush( *pvPis, Gia_ObjId(p,pObj) );   }
        else if ( !Vec_IntEntry(vGateClasses, Gia_ObjId(p,pObj)) )
            { if ( pvPPis )  Vec_IntPush( *pvPPis, Gia_ObjId(p,pObj) );  }
        else if ( Gia_ObjIsRo(p, pObj) )
            { if ( pvFlops ) Vec_IntPush( *pvFlops, Gia_ObjId(p,pObj) ); }
        else if ( Gia_ObjIsAnd(pObj) )
            { if ( pvNodes ) Vec_IntPush( *pvNodes, Gia_ObjId(p,pObj) ); }
        else assert( Gia_ObjIsConst0(pObj) );
    }
    Vec_IntFree( vAssigned );
}